

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void HalfMergeUVRow_AVX2(uint8_t *src_u,int src_stride_u,uint8_t *src_v,int src_stride_v,
                        uint8_t *dst_uv,int width)

{
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 *puVar4;
  int iVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 in_ZMM4 [64];
  int width_local;
  uint8_t *dst_uv_local;
  int src_stride_v_local;
  uint8_t *src_v_local;
  int src_stride_u_local;
  uint8_t *src_u_local;
  
  auVar8 = vpcmpeqb_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
  auVar8 = vpsrlw_avx2(auVar8,0xf);
  auVar8 = vpackuswb_avx2(auVar8,auVar8);
  do {
    auVar6 = *(undefined1 (*) [32])src_u;
    puVar4 = *(undefined1 (*) [32])src_u;
    src_u = (uint8_t *)((long)src_u + 0x20);
    auVar6 = vpmaddubsw_avx2(auVar6,auVar8);
    auVar7 = vpmaddubsw_avx2(*(undefined1 (*) [32])src_v,auVar8);
    auVar2 = vpmaddubsw_avx2(*(undefined1 (*) [32])(puVar4 + src_stride_u),auVar8);
    auVar3 = vpmaddubsw_avx2(*(undefined1 (*) [32])(*(undefined1 (*) [32])src_v + src_stride_v),
                             auVar8);
    src_v = (uint8_t *)((long)src_v + 0x20);
    auVar6 = vpaddw_avx2(auVar6,auVar2);
    auVar7 = vpaddw_avx2(auVar7,auVar3);
    auVar6 = vpsrlw_avx2(auVar6,1);
    auVar7 = vpsrlw_avx2(auVar7,1);
    auVar6 = vpavgw_avx2(auVar6,(undefined1  [32])0x0);
    auVar7 = vpavgw_avx2(auVar7,(undefined1  [32])0x0);
    auVar6 = vpackuswb_avx2(auVar6,auVar6);
    auVar7 = vpackuswb_avx2(auVar7,auVar7);
    auVar6 = vpunpcklbw_avx2(auVar6,auVar7);
    *(undefined1 (*) [32])dst_uv = auVar6;
    dst_uv = (uint8_t *)((long)dst_uv + 0x20);
    iVar5 = width + -0x20;
    bVar1 = 0x1f < width;
    width = iVar5;
  } while (iVar5 != 0 && bVar1);
  return;
}

Assistant:

void HalfMergeUVRow_AVX2(const uint8_t* src_u,
                         int src_stride_u,
                         const uint8_t* src_v,
                         int src_stride_v,
                         uint8_t* dst_uv,
                         int width) {
  asm volatile(
      "vpcmpeqb    %%ymm4,%%ymm4,%%ymm4          \n"
      "vpsrlw      $0xf,%%ymm4,%%ymm4            \n"
      "vpackuswb   %%ymm4,%%ymm4,%%ymm4          \n"
      "vpxor       %%ymm5,%%ymm5,%%ymm5          \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"  // load 32 U values
      "vmovdqu     (%1),%%ymm1                   \n"  // load 32 V values
      "vmovdqu     0(%0,%4,1),%%ymm2             \n"  // 32 from next row
      "vmovdqu     0(%1,%5,1),%%ymm3             \n"
      "lea         0x20(%0),%0                   \n"
      "vpmaddubsw  %%ymm4,%%ymm0,%%ymm0          \n"  // half size
      "vpmaddubsw  %%ymm4,%%ymm1,%%ymm1          \n"
      "vpmaddubsw  %%ymm4,%%ymm2,%%ymm2          \n"
      "vpmaddubsw  %%ymm4,%%ymm3,%%ymm3          \n"
      "lea         0x20(%1),%1                   \n"
      "vpaddw      %%ymm2,%%ymm0,%%ymm0          \n"
      "vpaddw      %%ymm3,%%ymm1,%%ymm1          \n"
      "vpsrlw      $0x1,%%ymm0,%%ymm0            \n"
      "vpsrlw      $0x1,%%ymm1,%%ymm1            \n"
      "vpavgw      %%ymm5,%%ymm0,%%ymm0          \n"
      "vpavgw      %%ymm5,%%ymm1,%%ymm1          \n"
      "vpackuswb   %%ymm0,%%ymm0,%%ymm0          \n"
      "vpackuswb   %%ymm1,%%ymm1,%%ymm1          \n"
      "vpunpcklbw  %%ymm1,%%ymm0,%%ymm0          \n"
      "vmovdqu     %%ymm0,(%2)                   \n"  // store 16 UV pixels
      "lea         0x20(%2),%2                   \n"
      "sub         $0x20,%3                      \n"  // 32 src pixels per loop
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_u),                    // %0
        "+r"(src_v),                    // %1
        "+r"(dst_uv),                   // %2
        "+r"(width)                     // %3
      : "r"((intptr_t)(src_stride_u)),  // %4
        "r"((intptr_t)(src_stride_v))   // %5
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}